

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O2

CaseResult * rc::detail::toCaseResult(CaseResult *__return_storage_ptr__,string *value)

{
  string *this;
  allocator local_51;
  string local_50;
  string local_30;
  
  if (value->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_50,"Returned empty string",&local_51);
    CaseResult::CaseResult(__return_storage_ptr__,Success,&local_50);
    this = &local_50;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,(string *)value);
    CaseResult::CaseResult(__return_storage_ptr__,Failure,&local_30);
    this = &local_30;
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

CaseResult toCaseResult(std::string value) {
  return value.empty()
      ? CaseResult(CaseResult::Type::Success, "Returned empty string")
      : CaseResult(CaseResult::Type::Failure, std::move(value));
}